

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateStructors
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_type sVar7;
  reference ppFVar8;
  string *psVar9;
  FileDescriptor *pFVar10;
  string *psVar11;
  size_t sVar12;
  char *pcVar13;
  OneofDescriptor *pOVar14;
  FieldGenerator *pFVar15;
  MessageOptions *this_00;
  Options *in_RCX;
  int __c;
  int i_00;
  Descriptor *descriptor;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  reference rVar16;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  FieldDescriptor *local_300;
  FieldDescriptor *field_2;
  int j;
  int i_2;
  string local_2c8;
  reference local_2a8;
  FieldDescriptor *local_298;
  FieldDescriptor *field_1;
  int i_1;
  vector<bool,_std::allocator<bool>_> processed;
  string local_258 [8];
  string cached_size_decl;
  undefined1 local_230 [7];
  bool need_to_emit_cached_size;
  string local_210;
  undefined1 local_1f0 [8];
  string initializer_null;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_119;
  FieldDescriptor *pFStack_118;
  bool has_arena_constructor;
  FieldDescriptor *field;
  undefined1 local_108 [4];
  int i;
  string initializer_with_arena;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string superclass;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  superclass.field_2._8_8_ = printer;
  std::__cxx11::string::string((string *)local_38);
  if ((this->use_dependent_base_ & 1U) == 0) {
    SuperClassName_abi_cxx11_
              ((string *)((long)&initializer_with_arena.field_2 + 8),(cpp *)this->descriptor_,
               (Descriptor *)&this->options_,in_RCX);
    std::__cxx11::string::operator=
              ((string *)local_38,(string *)(initializer_with_arena.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(initializer_with_arena.field_2._M_local_buf + 8));
  }
  else {
    DependentBaseClassTemplateName_abi_cxx11_(&local_b8,(cpp *)this->descriptor_,descriptor);
    std::operator+(&local_98,&local_b8,"<");
    std::operator+(&local_78,&local_98,&this->classname_);
    std::operator+(&local_58,&local_78,">");
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,"()")
  ;
  iVar4 = Descriptor::extension_range_count(this->descriptor_);
  if (0 < iVar4) {
    std::__cxx11::string::operator+=((string *)local_108,",\n  _extensions_(arena)");
  }
  std::__cxx11::string::operator+=((string *)local_108,",\n  _internal_metadata_(arena)");
  for (field._4_4_ = 0; uVar6 = (ulong)field._4_4_,
      sVar7 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->optimized_order_), uVar6 < sVar7; field._4_4_ = field._4_4_ + 1) {
    ppFVar8 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](&this->optimized_order_,(long)field._4_4_);
    pFStack_118 = *ppFVar8;
    local_119 = FieldDescriptor::is_repeated(pFStack_118);
    if ((bool)local_119) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,",\n  ",&local_181);
      FieldName_abi_cxx11_(&local_1a8,(cpp *)pFStack_118,field_00);
      std::operator+(&local_160,&local_180,&local_1a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"_(arena)",
                 (allocator<char> *)(initializer_null.field_2._M_local_buf + 0xf));
      std::operator+(&local_140,&local_160,&local_1c8);
      std::__cxx11::string::operator+=((string *)local_108,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(initializer_null.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator(&local_181);
    }
  }
  bVar3 = IsAnyMessage(this->descriptor_);
  if (bVar3) {
    std::__cxx11::string::operator+=((string *)local_108,",\n  _any_metadata_(&type_url_, &value_)")
    ;
  }
  if (0 < this->num_weak_fields_) {
    std::__cxx11::string::operator+=((string *)local_108,", _weak_field_map_(arena)");
  }
  std::__cxx11::string::string((string *)local_1f0);
  std::__cxx11::string::operator=((string *)local_1f0,", _internal_metadata_(NULL)");
  bVar3 = IsAnyMessage(this->descriptor_);
  if (bVar3) {
    std::__cxx11::string::operator+=((string *)local_1f0,", _any_metadata_(&type_url_, &value_)");
  }
  if (0 < this->num_weak_fields_) {
    std::__cxx11::string::operator+=((string *)local_1f0,", _weak_field_map_(NULL)");
  }
  uVar2 = superclass.field_2._8_8_;
  psVar9 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  pFVar10 = Descriptor::file(this->descriptor_);
  psVar11 = FileDescriptor::name_abi_cxx11_(pFVar10);
  FileLevelNamespace(&local_210,psVar11);
  io::Printer::Print((Printer *)uVar2,
                     "$classname$::$classname$()\n  : $superclass$()$initializer$ {\n  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {\n    $file_namespace$::InitDefaults();\n  }\n  SharedCtor();\n  // @@protoc_insertion_point(constructor:$full_name$)\n}\n"
                     ,"classname",&this->classname_,"superclass",(string *)local_38,"full_name",
                     psVar9,"initializer",(string *)local_1f0,"file_namespace",&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  bVar3 = SupportsArenas(this->descriptor_);
  uVar2 = superclass.field_2._8_8_;
  if (bVar3) {
    psVar9 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
    pFVar10 = Descriptor::file(this->descriptor_);
    psVar11 = FileDescriptor::name_abi_cxx11_(pFVar10);
    FileLevelNamespace((string *)local_230,psVar11);
    io::Printer::Print((Printer *)uVar2,
                       "$classname$::$classname$(::google::protobuf::Arena* arena)\n  : $initializer$ {\n#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n  $file_namespace$::InitDefaults();\n#endif  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n  SharedCtor();\n  RegisterArenaDtor(arena);\n  // @@protoc_insertion_point(arena_constructor:$full_name$)\n}\n"
                       ,"initializer",(string *)local_108,"classname",&this->classname_,"superclass"
                       ,(string *)local_38,"full_name",psVar9,"file_namespace",(string *)local_230);
    std::__cxx11::string::~string((string *)local_230);
  }
  uVar2 = superclass.field_2._8_8_;
  psVar9 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  io::Printer::Print((Printer *)uVar2,
                     "$classname$::$classname$(const $classname$& from)\n  : $superclass$()",
                     "classname",&this->classname_,"superclass",(string *)local_38,"full_name",
                     psVar9);
  io::Printer::Indent((Printer *)superclass.field_2._8_8_);
  io::Printer::Indent((Printer *)superclass.field_2._8_8_);
  io::Printer::Indent((Printer *)superclass.field_2._8_8_);
  io::Printer::Print((Printer *)superclass.field_2._8_8_,",\n_internal_metadata_(NULL)");
  pFVar10 = Descriptor::file(this->descriptor_);
  bVar3 = HasFieldPresence(pFVar10);
  if (bVar3) {
    io::Printer::Print((Printer *)superclass.field_2._8_8_,",\n_has_bits_(from._has_bits_)");
  }
  cached_size_decl.field_2._M_local_buf[0xf] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,",\n_cached_size_(0)",
             (allocator<char> *)
             ((long)&processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&processed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7));
  pFVar10 = Descriptor::file(this->descriptor_);
  bVar3 = HasFieldPresence(pFVar10);
  if ((bVar3) && (sVar12 = HasBitsSize(this), uVar2 = superclass.field_2._8_8_, (sVar12 & 7) != 0))
  {
    pcVar13 = (char *)std::__cxx11::string::c_str();
    io::Printer::Print((Printer *)uVar2,pcVar13);
    cached_size_decl.field_2._M_local_buf[0xf] = '\0';
  }
  sVar7 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::size(&this->optimized_order_);
  field_1._7_1_ = 0;
  std::allocator<bool>::allocator((allocator<bool> *)((long)&field_1 + 6));
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&i_1,sVar7,(bool *)((long)&field_1 + 7),
             (allocator<bool> *)((long)&field_1 + 6));
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&field_1 + 6));
  field_1._0_4_ = 0;
  while( true ) {
    uVar6 = (ulong)(int)field_1;
    sVar7 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(&this->optimized_order_);
    uVar2 = superclass.field_2._8_8_;
    if (sVar7 <= uVar6) break;
    ppFVar8 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](&this->optimized_order_,(long)(int)field_1);
    local_298 = *ppFVar8;
    bVar3 = FieldDescriptor::is_repeated(local_298);
    if (bVar3) {
      bVar3 = FieldDescriptor::is_map(local_298);
      if (!bVar3) {
        rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&i_1,(long)(int)field_1);
        local_2a8 = rVar16;
        std::_Bit_reference::operator=(&local_2a8,true);
        uVar2 = superclass.field_2._8_8_;
        FieldName_abi_cxx11_(&local_2c8,(cpp *)local_298,field_01);
        io::Printer::Print((Printer *)uVar2,",\n$name$_(from.$name$_)","name",&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
      }
    }
    field_1._0_4_ = (int)field_1 + 1;
  }
  if ((cached_size_decl.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar13 = (char *)std::__cxx11::string::c_str();
    io::Printer::Print((Printer *)uVar2,pcVar13);
    cached_size_decl.field_2._M_local_buf[0xf] = '\0';
  }
  bVar3 = IsAnyMessage(this->descriptor_);
  if (bVar3) {
    io::Printer::Print((Printer *)superclass.field_2._8_8_,",\n_any_metadata_(&type_url_, &value_)")
    ;
  }
  if (0 < this->num_weak_fields_) {
    io::Printer::Print((Printer *)superclass.field_2._8_8_,
                       ",\n_weak_field_map_(from._weak_field_map_)");
  }
  io::Printer::Outdent((Printer *)superclass.field_2._8_8_);
  io::Printer::Outdent((Printer *)superclass.field_2._8_8_);
  io::Printer::Print((Printer *)superclass.field_2._8_8_," {\n");
  io::Printer::Print((Printer *)superclass.field_2._8_8_,
                     "_internal_metadata_.MergeFrom(from._internal_metadata_);\n");
  iVar4 = Descriptor::extension_range_count(this->descriptor_);
  if (0 < iVar4) {
    io::Printer::Print((Printer *)superclass.field_2._8_8_,
                       "_extensions_.MergeFrom(from._extensions_);\n");
  }
  uVar2 = superclass.field_2._8_8_;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&j,(vector<bool,_std::allocator<bool>_> *)&i_1);
  GenerateConstructorBody(this,(Printer *)uVar2,(vector<bool,_std::allocator<bool>_> *)&j,true);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&j);
  field_2._4_4_ = 0;
  while( true ) {
    uVar1 = field_2._4_4_;
    iVar4 = Descriptor::oneof_decl_count(this->descriptor_);
    uVar2 = superclass.field_2._8_8_;
    if (iVar4 <= (int)uVar1) break;
    pOVar14 = Descriptor::oneof_decl(this->descriptor_,field_2._4_4_);
    psVar9 = OneofDescriptor::name_abi_cxx11_(pOVar14);
    io::Printer::Print((Printer *)uVar2,
                       "clear_has_$oneofname$();\nswitch (from.$oneofname$_case()) {\n","oneofname",
                       psVar9);
    io::Printer::Indent((Printer *)superclass.field_2._8_8_);
    field_2._0_4_ = 0;
    while( true ) {
      iVar4 = (int)field_2;
      pOVar14 = Descriptor::oneof_decl(this->descriptor_,field_2._4_4_);
      iVar5 = OneofDescriptor::field_count(pOVar14);
      uVar2 = superclass.field_2._8_8_;
      if (iVar5 <= iVar4) break;
      pOVar14 = Descriptor::oneof_decl(this->descriptor_,field_2._4_4_);
      local_300 = OneofDescriptor::field(pOVar14,(int)field_2);
      uVar2 = superclass.field_2._8_8_;
      psVar9 = FieldDescriptor::name_abi_cxx11_(local_300);
      UnderscoresToCamelCase(&local_320,psVar9,true);
      io::Printer::Print((Printer *)uVar2,"case k$field_name$: {\n","field_name",&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      io::Printer::Indent((Printer *)superclass.field_2._8_8_);
      pFVar15 = FieldGeneratorMap::get(&this->field_generators_,local_300);
      (*pFVar15->_vptr_FieldGenerator[0xb])(pFVar15,superclass.field_2._8_8_);
      io::Printer::Print((Printer *)superclass.field_2._8_8_,"break;\n");
      io::Printer::Outdent((Printer *)superclass.field_2._8_8_);
      io::Printer::Print((Printer *)superclass.field_2._8_8_,"}\n");
      field_2._0_4_ = (int)field_2 + 1;
    }
    pcVar13 = (char *)(ulong)field_2._4_4_;
    pOVar14 = Descriptor::oneof_decl(this->descriptor_,field_2._4_4_);
    pcVar13 = OneofDescriptor::index(pOVar14,pcVar13,__c);
    SimpleItoa_abi_cxx11_(&local_340,(protobuf *)((ulong)pcVar13 & 0xffffffff),i_00);
    pOVar14 = Descriptor::oneof_decl(this->descriptor_,field_2._4_4_);
    psVar9 = OneofDescriptor::name_abi_cxx11_(pOVar14);
    ToUpper(&local_360,psVar9);
    io::Printer::Print((Printer *)uVar2,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n",
                       "oneof_index",&local_340,"cap_oneof_name",&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    io::Printer::Outdent((Printer *)superclass.field_2._8_8_);
    io::Printer::Print((Printer *)superclass.field_2._8_8_,"}\n");
    field_2._4_4_ = field_2._4_4_ + 1;
  }
  io::Printer::Outdent((Printer *)superclass.field_2._8_8_);
  uVar2 = superclass.field_2._8_8_;
  psVar9 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  io::Printer::Print((Printer *)uVar2,
                     "  // @@protoc_insertion_point(copy_constructor:$full_name$)\n}\n\n",
                     "full_name",psVar9);
  GenerateSharedConstructorCode(this,(Printer *)superclass.field_2._8_8_);
  uVar2 = superclass.field_2._8_8_;
  psVar9 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  io::Printer::Print((Printer *)uVar2,
                     "$classname$::~$classname$() {\n  // @@protoc_insertion_point(destructor:$full_name$)\n  SharedDtor();\n}\n\n"
                     ,"classname",&this->classname_,"full_name",psVar9);
  GenerateSharedDestructorCode(this,(Printer *)superclass.field_2._8_8_);
  bVar3 = SupportsArenas(this->descriptor_);
  if (bVar3) {
    GenerateArenaDestructorCode(this,(Printer *)superclass.field_2._8_8_);
  }
  io::Printer::Print((Printer *)superclass.field_2._8_8_,
                     "void $classname$::SetCachedSize(int size) const {\n  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n}\n"
                     ,"classname",&this->classname_);
  pFVar10 = Descriptor::file(this->descriptor_);
  bVar3 = HasDescriptorMethods(pFVar10,&this->options_);
  if (bVar3) {
    this_00 = Descriptor::options(this->descriptor_);
    bVar3 = MessageOptions::no_standard_descriptor_accessor(this_00);
    uVar2 = superclass.field_2._8_8_;
    if (!bVar3) {
      pFVar10 = Descriptor::file(this->descriptor_);
      psVar9 = FileDescriptor::name_abi_cxx11_(pFVar10);
      FileLevelNamespace(&local_380,psVar9);
      io::Printer::Print((Printer *)uVar2,
                         "const ::google::protobuf::Descriptor* $classname$::descriptor() {\n  $file_namespace$::protobuf_AssignDescriptorsOnce();\n  return $file_namespace$::file_level_metadata[kIndexInFileMessages].descriptor;\n}\n\n"
                         ,"classname",&this->classname_,"file_namespace",&local_380);
      std::__cxx11::string::~string((string *)&local_380);
    }
  }
  uVar2 = superclass.field_2._8_8_;
  pFVar10 = Descriptor::file(this->descriptor_);
  psVar9 = FileDescriptor::name_abi_cxx11_(pFVar10);
  FileLevelNamespace(&local_3a0,psVar9);
  io::Printer::Print((Printer *)uVar2,
                     "const $classname$& $classname$::default_instance() {\n  $file_namespace$::InitDefaults();\n  return *internal_default_instance();\n}\n\n"
                     ,"classname",&this->classname_,"file_namespace",&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  bVar3 = SupportsArenas(this->descriptor_);
  if (bVar3) {
    io::Printer::Print((Printer *)superclass.field_2._8_8_,
                       "$classname$* $classname$::New(::google::protobuf::Arena* arena) const {\n  return ::google::protobuf::Arena::CreateMessage<$classname$>(arena);\n}\n"
                       ,"classname",&this->classname_);
  }
  else {
    io::Printer::Print((Printer *)superclass.field_2._8_8_,
                       "$classname$* $classname$::New(::google::protobuf::Arena* arena) const {\n  $classname$* n = new $classname$;\n  if (arena != NULL) {\n    arena->Own(n);\n  }\n  return n;\n}\n"
                       ,"classname",&this->classname_);
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i_1);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void MessageGenerator::
GenerateStructors(io::Printer* printer) {
  string superclass;
  if (use_dependent_base_) {
    superclass =
        DependentBaseClassTemplateName(descriptor_) + "<" + classname_ + ">";
  } else {
    superclass = SuperClassName(descriptor_, options_);
  }
  string initializer_with_arena = superclass + "()";

  if (descriptor_->extension_range_count() > 0) {
    initializer_with_arena += ",\n  _extensions_(arena)";
  }

  initializer_with_arena += ",\n  _internal_metadata_(arena)";

  // Initialize member variables with arena constructor.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];

    bool has_arena_constructor = field->is_repeated();
    if (has_arena_constructor) {
      initializer_with_arena += string(",\n  ") +
          FieldName(field) + string("_(arena)");
    }
  }

  if (IsAnyMessage(descriptor_)) {
    initializer_with_arena += ",\n  _any_metadata_(&type_url_, &value_)";
  }
  if (num_weak_fields_ > 0) {
    initializer_with_arena += ", _weak_field_map_(arena)";
  }

  string initializer_null;
  initializer_null = ", _internal_metadata_(NULL)";
  if (IsAnyMessage(descriptor_)) {
    initializer_null += ", _any_metadata_(&type_url_, &value_)";
  }
  if (num_weak_fields_ > 0) {
    initializer_null += ", _weak_field_map_(NULL)";
  }

  printer->Print(
      "$classname$::$classname$()\n"
      "  : $superclass$()$initializer$ {\n"
      "  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {\n"
      "    $file_namespace$::InitDefaults();\n"
      "  }\n"
      "  SharedCtor();\n"
      "  // @@protoc_insertion_point(constructor:$full_name$)\n"
      "}\n",
      "classname", classname_, "superclass", superclass, "full_name",
      descriptor_->full_name(), "initializer", initializer_null,
      "file_namespace", FileLevelNamespace(descriptor_->file()->name()));

  if (SupportsArenas(descriptor_)) {
    printer->Print(
        "$classname$::$classname$(::google::protobuf::Arena* arena)\n"
        "  : $initializer$ {\n"
        // When arenas are used it's safe to assume we have finished
        // static init time (protos with arenas are unsafe during static init)
        "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n"
        "  $file_namespace$::InitDefaults();\n"
        "#endif  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n"
        "  SharedCtor();\n"
        "  RegisterArenaDtor(arena);\n"
        "  // @@protoc_insertion_point(arena_constructor:$full_name$)\n"
        "}\n",
        "initializer", initializer_with_arena, "classname", classname_,
        "superclass", superclass, "full_name", descriptor_->full_name(),
        "file_namespace", FileLevelNamespace(descriptor_->file()->name()));
  }

  // Generate the copy constructor.
  printer->Print(
    "$classname$::$classname$(const $classname$& from)\n"
    "  : $superclass$()",
    "classname", classname_,
    "superclass", superclass,
    "full_name", descriptor_->full_name());
  printer->Indent();
  printer->Indent();
  printer->Indent();

  printer->Print(
      ",\n_internal_metadata_(NULL)");

  if (HasFieldPresence(descriptor_->file())) {
      printer->Print(",\n_has_bits_(from._has_bits_)");
  }

  bool need_to_emit_cached_size = true;
  const string cached_size_decl = ",\n_cached_size_(0)";
  // We reproduce the logic used for laying out _cached_sized_ in the class
  // definition, as to initialize it in-order.
  if (HasFieldPresence(descriptor_->file()) &&
      (HasBitsSize() % 8) != 0) {
    printer->Print(cached_size_decl.c_str());
    need_to_emit_cached_size = false;
  }

  std::vector<bool> processed(optimized_order_.size(), false);
  for (int i = 0; i < optimized_order_.size(); ++i) {
    const FieldDescriptor* field = optimized_order_[i];

    if (!(field->is_repeated() && !(field->is_map()))
        ) {
      continue;
    }

    processed[i] = true;
    printer->Print(",\n$name$_(from.$name$_)",
                   "name", FieldName(field));
  }

  if (need_to_emit_cached_size) {
    printer->Print(cached_size_decl.c_str());
    need_to_emit_cached_size = false;
  }

  if (IsAnyMessage(descriptor_)) {
    printer->Print(",\n_any_metadata_(&type_url_, &value_)");
  }
  if (num_weak_fields_ > 0) {
    printer->Print(",\n_weak_field_map_(from._weak_field_map_)");
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(" {\n");

  printer->Print(
      "_internal_metadata_.MergeFrom(from._internal_metadata_);\n");

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.MergeFrom(from._extensions_);\n");
  }

  GenerateConstructorBody(printer, processed, true);

  // Copy oneof fields. Oneof field requires oneof case check.
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    printer->Print(
        "clear_has_$oneofname$();\n"
        "switch (from.$oneofname$_case()) {\n",
        "oneofname", descriptor_->oneof_decl(i)->name());
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      field_generators_.get(field).GenerateMergingCode(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "oneof_index",
        SimpleItoa(descriptor_->oneof_decl(i)->index()),
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }

  printer->Outdent();
  printer->Print(
    "  // @@protoc_insertion_point(copy_constructor:$full_name$)\n"
    "}\n"
    "\n",
    "full_name", descriptor_->full_name());

  // Generate the shared constructor code.
  GenerateSharedConstructorCode(printer);

  // Generate the destructor.
  printer->Print(
    "$classname$::~$classname$() {\n"
    "  // @@protoc_insertion_point(destructor:$full_name$)\n"
    "  SharedDtor();\n"
    "}\n"
    "\n",
    "classname", classname_,
    "full_name", descriptor_->full_name());

  // Generate the shared destructor code.
  GenerateSharedDestructorCode(printer);

  // Generate the arena-specific destructor code.
  if (SupportsArenas(descriptor_)) {
    GenerateArenaDestructorCode(printer);
  }

  // Generate SetCachedSize.
  printer->Print(
    "void $classname$::SetCachedSize(int size) const {\n"
    "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "  _cached_size_ = size;\n"
    "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "}\n",
    "classname", classname_);

  // Only generate this member if it's not disabled.
  if (HasDescriptorMethods(descriptor_->file(), options_) &&
      !descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
        "const ::google::protobuf::Descriptor* $classname$::descriptor() {\n"
        "  $file_namespace$::protobuf_AssignDescriptorsOnce();\n"
        "  return "
        "$file_namespace$::file_level_metadata[kIndexInFileMessages]."
        "descriptor;\n"
        "}\n"
        "\n",
        "classname", classname_, "file_namespace",
        FileLevelNamespace(descriptor_->file()->name()));
  }

  printer->Print(
      "const $classname$& $classname$::default_instance() {\n"
      "  $file_namespace$::InitDefaults();\n"
      "  return *internal_default_instance();\n"
      "}\n\n",
      "classname", classname_, "file_namespace",
      FileLevelNamespace(descriptor_->file()->name()));

  if (SupportsArenas(descriptor_)) {
    printer->Print(
      "$classname$* $classname$::New(::google::protobuf::Arena* arena) const {\n"
      "  return ::google::protobuf::Arena::CreateMessage<$classname$>(arena);\n"
      "}\n",
      "classname", classname_);
  } else {
    printer->Print(
      "$classname$* $classname$::New(::google::protobuf::Arena* arena) const {\n"
      "  $classname$* n = new $classname$;\n"
      "  if (arena != NULL) {\n"
      "    arena->Own(n);\n"
      "  }\n"
      "  return n;\n"
      "}\n",
      "classname", classname_);
  }

}